

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int local_9c;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int j;
  double sum2B;
  double sum1B;
  double sum2A;
  double sum1A;
  double *matrices2Ptr;
  double *matrices1Ptr;
  int i;
  int k;
  double *destPtr;
  double *partials2Ptr;
  double *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  int stateCountModFour;
  int matrixIncr;
  double *matrices2_local;
  
  iVar4 = this->kStateCount + 1;
  iVar1 = this->kStateCount;
  for (k = 0; k < this->kCategoryCount; k = k + 1) {
    iVar2 = k * this->kPartialsPaddedStateCount * this->kPatternCount +
            this->kPartialsPaddedStateCount * startPattern;
    iVar3 = k * this->kMatrixSize;
    matrices2Ptr = partials1 + iVar2;
    sum1A = (double)(partials2 + iVar2);
    sum2A = (double)(destP + iVar2);
    for (sum1B._4_4_ = startPattern; sum1B._4_4_ < endPattern; sum1B._4_4_ = sum1B._4_4_ + 1) {
      for (sum1B._0_4_ = 0; sum1B._0_4_ < this->kStateCount; sum1B._0_4_ = sum1B._0_4_ + 1) {
        lVar5 = (long)(sum1B._0_4_ * iVar4);
        lVar6 = (long)(sum1B._0_4_ * iVar4);
        local_80 = 0.0;
        local_88 = 0.0;
        local_90 = 0.0;
        local_98 = 0.0;
        for (local_9c = 0; local_9c < iVar1 / 4 << 2; local_9c = local_9c + 4) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = matrices1[(long)iVar3 + lVar5 + local_9c];
          auVar7._8_8_ = 0;
          auVar7._0_8_ = matrices2Ptr[local_9c];
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_80;
          auVar7 = vfmadd213sd_fma(auVar7,auVar17,auVar27);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = matrices2[(long)iVar3 + lVar6 + local_9c];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)sum1A + (long)local_9c * 8);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_88;
          auVar8 = vfmadd213sd_fma(auVar8,auVar18,auVar28);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = matrices1[(long)iVar3 + lVar5 + (local_9c + 1)];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = matrices2Ptr[local_9c + 1];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_90;
          auVar9 = vfmadd213sd_fma(auVar9,auVar19,auVar29);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = matrices2[(long)iVar3 + lVar6 + (local_9c + 1)];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)sum1A + (long)(local_9c + 1) * 8);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_98;
          auVar10 = vfmadd213sd_fma(auVar10,auVar20,auVar30);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = matrices1[(long)iVar3 + lVar5 + (local_9c + 2)];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = matrices2Ptr[local_9c + 2];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = auVar7._0_8_;
          auVar7 = vfmadd213sd_fma(auVar11,auVar21,auVar31);
          local_80 = auVar7._0_8_;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = matrices2[(long)iVar3 + lVar6 + (local_9c + 2)];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)((long)sum1A + (long)(local_9c + 2) * 8);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = auVar8._0_8_;
          auVar7 = vfmadd213sd_fma(auVar12,auVar22,auVar32);
          local_88 = auVar7._0_8_;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = matrices1[(long)iVar3 + lVar5 + (local_9c + 3)];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = matrices2Ptr[local_9c + 3];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = auVar9._0_8_;
          auVar7 = vfmadd213sd_fma(auVar13,auVar23,auVar33);
          local_90 = auVar7._0_8_;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = matrices2[(long)iVar3 + lVar6 + (local_9c + 3)];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)((long)sum1A + (long)(local_9c + 3) * 8);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar10._0_8_;
          auVar7 = vfmadd213sd_fma(auVar14,auVar24,auVar34);
          local_98 = auVar7._0_8_;
        }
        for (; local_9c < this->kStateCount; local_9c = local_9c + 1) {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = matrices1[(long)iVar3 + lVar5 + local_9c];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = matrices2Ptr[local_9c];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_80;
          auVar7 = vfmadd213sd_fma(auVar15,auVar25,auVar35);
          local_80 = auVar7._0_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = matrices2[(long)iVar3 + lVar6 + local_9c];
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)((long)sum1A + (long)local_9c * 8);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_88;
          auVar7 = vfmadd213sd_fma(auVar16,auVar26,auVar36);
          local_88 = auVar7._0_8_;
        }
        *(double *)sum2A = (local_80 + local_90) * (local_88 + local_98);
        sum2A = (double)((long)sum2A + 8);
      }
      matrices2Ptr = matrices2Ptr + this->kPartialsPaddedStateCount;
      sum1A = (double)((long)sum1A + (long)this->kPartialsPaddedStateCount * 8);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                             const REALTYPE* partials1,
                                                             const REALTYPE* matrices1,
                                                             const REALTYPE* partials2,
                                                             const REALTYPE* matrices2,
                                                             int startPattern,
                                                             int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {

            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B);
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}